

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O1

DirPathPair * __thiscall
capnp::compiler::CompilerMain::interpretSourceFile
          (DirPathPair *__return_storage_ptr__,CompilerMain *this,StringPtr pathStr)

{
  OutputDirective *pOVar1;
  ProcessContext *pPVar2;
  long lVar3;
  PathPtr prefix_00;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  Maybe<capnp::compiler::CompilerMain::SourceDirectory_&> MVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t sVar7;
  size_t extraout_RDX;
  void *__child_stack;
  String *pSVar8;
  DirPathPair *pDVar9;
  char *pcVar10;
  void *in_R8;
  long lVar11;
  OutputDirective *pOVar12;
  PathPtr prefix;
  Path path;
  Fault f;
  PathPtr cwd;
  String local_d8;
  Path local_b8;
  String local_98;
  DirPathPair *local_78;
  ArrayPtr<const_char> *local_70;
  size_t local_68;
  PathPtr local_60;
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> *local_40;
  long local_38;
  
  local_78 = __return_storage_ptr__;
  iVar5 = (*((this->disk).ptr)->_vptr_Filesystem[2])();
  local_60.parts.ptr = (String *)CONCAT44(extraout_var,iVar5);
  local_60.parts.size_ = extraout_RDX;
  kj::PathPtr::eval(&local_b8,&local_60,pathStr);
  if ((String *)local_b8.parts.size_ == (String *)0x0) {
    local_98.content.ptr = (char *)0x0;
    local_d8.content.ptr = (char *)0x0;
    local_d8.content.size_ = 0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_98,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/capnp.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_98);
  }
  pSVar8 = (String *)((long)&(((String *)(local_b8.parts.size_ + -0x18))->content).disposer + 7);
  local_70 = (ArrayPtr<const_char> *)pathStr.content.ptr;
  local_68 = pathStr.content.size_;
  if (pSVar8 != (String *)0x0) {
    lVar11 = 1 - local_b8.parts.size_;
    lVar3 = local_b8.parts.size_ * 0x18;
    do {
      local_d8.content.ptr = (char *)local_b8.parts.ptr;
      local_98.content.ptr = (char *)((long)&local_b8.parts.ptr[-1].content.ptr + lVar3);
      sVar7 = (long)&((Array<char> *)local_b8.parts.size_)->ptr + lVar11;
      local_d8.content.size_ = (size_t)pSVar8;
      local_98.content.size_ = sVar7;
      MVar6 = kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::
              find<kj::PathPtr&>((HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory> *
                                 )&this->sourceDirectories,(PathPtr *)&local_d8);
      pDVar9 = local_78;
      if (MVar6.ptr != (SourceDirectory *)0x0) {
        local_78->dir = ((MVar6.ptr)->dir).ptr;
        kj::PathPtr::clone((PathPtr *)&local_78->path,(__fn *)&local_98,__child_stack,(int)sVar7,
                           in_R8);
        goto LAB_00197ce2;
      }
      pSVar8 = (String *)((long)&pSVar8[-1].content.disposer + 7);
      lVar11 = lVar11 + 1;
      lVar3 = lVar3 + -0x18;
    } while (lVar11 != 0);
  }
  prefix_00.parts.size_ = local_60.parts.size_;
  prefix_00.parts.ptr = local_60.parts.ptr;
  local_d8.content.ptr = (char *)local_b8.parts.ptr;
  local_d8.content.size_ = local_b8.parts.size_;
  bVar4 = kj::PathPtr::startsWith((PathPtr *)&local_d8,prefix_00);
  if (bVar4) {
    iVar5 = (*((this->disk).ptr)->_vptr_Filesystem[1])();
    pDVar9 = local_78;
    local_78->dir = (ReadableDirectory *)CONCAT44(extraout_var_00,iVar5);
    local_d8.content.ptr = (char *)(local_b8.parts.ptr + local_60.parts.size_);
    local_d8.content.size_ = local_b8.parts.size_ - local_60.parts.size_;
    kj::PathPtr::clone((PathPtr *)&local_78->path,(__fn *)&local_d8,local_d8.content.ptr,
                       (int)local_d8.content.size_,in_R8);
  }
  else {
    pOVar12 = (this->outputs).builder.ptr;
    pOVar1 = (this->outputs).builder.pos;
    if (pOVar12 != pOVar1) {
      do {
        pcVar10 = (pOVar12->name).ptr;
        sVar7 = (pOVar12->name).size_;
        kj::heapString(&local_d8,sVar7);
        if (sVar7 != 0) {
          pSVar8 = (String *)local_d8.content.size_;
          if ((String *)local_d8.content.size_ != (String *)0x0) {
            pSVar8 = (String *)local_d8.content.ptr;
          }
          memcpy(pSVar8,pcVar10,sVar7);
        }
        sVar7 = local_d8.content.size_;
        if ((String *)local_d8.content.size_ != (String *)0x6) {
          if ((String *)local_d8.content.size_ == (String *)0x2) {
            iVar5 = bcmp(local_d8.content.ptr,"-",
                         (ulong)((String *)local_d8.content.size_ == (String *)0x0) + 1);
            pSVar8 = (String *)local_d8.content.ptr;
            goto joined_r0x00197b67;
          }
LAB_00197be5:
          pPVar2 = this->context;
          local_38 = local_68 - 1;
          local_40 = local_70;
          local_50.ptr = 
          ": File is not in the current directory and does not match any prefix defined with --src-prefix. Please pass an appropriate --src-prefix so I can figure out where to write the output for this file."
          ;
          local_50.size_ = 0xc4;
          kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                    (&local_98,(_ *)&local_40,&local_50,local_70);
          pcVar10 = local_98.content.ptr;
          if (local_98.content.size_ == 0) {
            pcVar10 = "";
          }
          (*pPVar2->_vptr_ProcessContext[2])
                    (pPVar2,pcVar10,local_98.content.size_ + (local_98.content.size_ == 0));
          sVar7 = local_98.content.size_;
          pcVar10 = local_98.content.ptr;
          if (local_98.content.ptr != (char *)0x0) {
            local_98.content.ptr = (char *)0x0;
            local_98.content.size_ = 0;
            (**(local_98.content.disposer)->_vptr_ArrayDisposer)
                      (local_98.content.disposer,pcVar10,1,sVar7,sVar7,0);
          }
          sVar7 = local_d8.content.size_;
          pcVar10 = local_d8.content.ptr;
          if ((String *)local_d8.content.ptr != (String *)0x0) {
            local_d8.content.ptr = (char *)0x0;
            local_d8.content.size_ = 0;
            (**(local_d8.content.disposer)->_vptr_ArrayDisposer)
                      (local_d8.content.disposer,pcVar10,1,sVar7,sVar7,0);
          }
          break;
        }
        iVar5 = bcmp(local_d8.content.ptr,"capnp",
                     (ulong)((String *)local_d8.content.size_ == (String *)0x0) + 5);
        pSVar8 = (String *)local_d8.content.ptr;
joined_r0x00197b67:
        local_d8.content.ptr = (char *)pSVar8;
        if (iVar5 != 0) goto LAB_00197be5;
        if (pSVar8 != (String *)0x0) {
          local_d8.content.ptr = (char *)0x0;
          local_d8.content.size_ = 0;
          (**(local_d8.content.disposer)->_vptr_ArrayDisposer)
                    (local_d8.content.disposer,pSVar8,1,sVar7,sVar7);
        }
        pOVar12 = pOVar12 + 1;
      } while (pOVar12 != pOVar1);
    }
    iVar5 = (**((this->disk).ptr)->_vptr_Filesystem)();
    local_78->dir = (ReadableDirectory *)CONCAT44(extraout_var_01,iVar5);
    (local_78->path).parts.ptr = local_b8.parts.ptr;
    (local_78->path).parts.size_ = local_b8.parts.size_;
    (local_78->path).parts.disposer = local_b8.parts.disposer;
    local_b8.parts.ptr = (String *)0x0;
    local_b8.parts.size_ = 0;
    pDVar9 = local_78;
  }
LAB_00197ce2:
  sVar7 = local_b8.parts.size_;
  pSVar8 = local_b8.parts.ptr;
  if (local_b8.parts.ptr != (String *)0x0) {
    local_b8.parts.ptr = (String *)0x0;
    local_b8.parts.size_ = 0;
    (**(local_b8.parts.disposer)->_vptr_ArrayDisposer)
              (local_b8.parts.disposer,pSVar8,0x18,sVar7,sVar7,
               kj::ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  return pDVar9;
}

Assistant:

DirPathPair interpretSourceFile(kj::StringPtr pathStr) {
    auto cwd = disk->getCurrentPath();
    auto path = cwd.evalNative(pathStr);

    KJ_REQUIRE(path.size() > 0);
    for (size_t i = path.size() - 1; i > 0; i--) {
      auto prefix = path.slice(0, i);
      auto remainder = path.slice(i, path.size());

      KJ_IF_MAYBE(sdir, sourceDirectories.find(prefix)) {
        return { *sdir->dir, remainder.clone() };
      }
    }

    // No source prefix matched. Fall back to heuristic: try stripping the current directory,
    // otherwise don't strip anything.
    if (path.startsWith(cwd)) {
      return { disk->getCurrent(), path.slice(cwd.size(), path.size()).clone() };
    } else {
      // Hmm, no src-prefix matched and the file isn't even in the current directory. This might
      // be OK if we aren't generating any output anyway, but otherwise the results will almost
      // certainly not be what the user wanted. Let's print a warning, unless the output directives
      // are ones which we know do not produce output files. This is a hack.
      for (auto& output: outputs) {
        auto name = kj::str(output.name);
        if (name != "-" && name != "capnp") {
          context.warning(kj::str(pathStr,
              ": File is not in the current directory and does not match any prefix defined with "
              "--src-prefix. Please pass an appropriate --src-prefix so I can figure out where to "
              "write the output for this file."));
          break;
        }
      }

      return { disk->getRoot(), kj::mv(path) };
    }
  }